

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O0

int spki_table_copy_except_socket(spki_table *src,spki_table *dst,rtr_socket *socket)

{
  key_entry *key_e;
  int iVar1;
  long in_FS_OFFSET;
  key_entry *entry;
  tommy_node_struct *ptStack_b0;
  int ret;
  tommy_node *current_node;
  rtr_socket *socket_local;
  spki_table *dst_local;
  spki_table *src_local;
  spki_record record;
  
  record.socket = *(rtr_socket **)(in_FS_OFFSET + 0x28);
  entry._4_4_ = 0;
  pthread_rwlock_rdlock((pthread_rwlock_t *)&src->lock);
  ptStack_b0 = tommy_list_head(&src->list);
  do {
    if (ptStack_b0 == (tommy_node *)0x0) {
LAB_00112b10:
      pthread_rwlock_unlock((pthread_rwlock_t *)&src->lock);
      if (*(rtr_socket **)(in_FS_OFFSET + 0x28) != record.socket) {
        __stack_chk_fail();
      }
      return entry._4_4_;
    }
    key_e = (key_entry *)ptStack_b0->data;
    key_entry_to_spki_record(key_e,(spki_record *)&src_local);
    if ((key_e->socket != socket) &&
       (iVar1 = spki_table_add_entry(dst,(spki_record *)&src_local), iVar1 != 0)) {
      entry._4_4_ = -1;
      goto LAB_00112b10;
    }
    ptStack_b0 = ptStack_b0->next;
  } while( true );
}

Assistant:

int spki_table_copy_except_socket(struct spki_table *src, struct spki_table *dst, struct rtr_socket *socket)
{
	tommy_node *current_node;
	int ret = SPKI_SUCCESS;

	pthread_rwlock_rdlock(&src->lock);
	current_node = tommy_list_head(&src->list);
	while (current_node) {
		struct key_entry *entry;
		struct spki_record record;

		entry = (struct key_entry *)current_node->data;
		key_entry_to_spki_record(entry, &record);

		if (entry->socket != socket) {
			if (spki_table_add_entry(dst, &record) != SPKI_SUCCESS) {
				ret = SPKI_ERROR;
				break;
			}
		}
		current_node = current_node->next;
	}

	pthread_rwlock_unlock(&src->lock);

	return ret;
}